

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

Instr * __thiscall LowererMD::Simd128LowerMulI4(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  undefined4 *puVar4;
  Opnd *this_00;
  Opnd *this_01;
  Opnd *this_02;
  RegOpnd *dstOpnd;
  RegOpnd *dstOpnd_00;
  RegOpnd *dstOpnd_01;
  Instr *pIVar5;
  IntConstOpnd *pIVar6;
  Opnd *temp3;
  Opnd *temp2;
  Opnd *temp1;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  Instr *pInstr;
  Instr *instr_local;
  LowererMD *this_local;
  
  if ((instr->m_opcode != Simd128_Mul_I4) && (instr->m_opcode != Simd128_Mul_U4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x3d6,
                       "(instr->m_opcode == Js::OpCode::Simd128_Mul_I4 || instr->m_opcode == Js::OpCode::Simd128_Mul_U4)"
                       ,
                       "instr->m_opcode == Js::OpCode::Simd128_Mul_I4 || instr->m_opcode == Js::OpCode::Simd128_Mul_U4"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = IR::Instr::GetDst(instr);
  this_01 = IR::Instr::GetSrc1(instr);
  this_02 = IR::Instr::GetSrc2(instr);
  bVar2 = IR::Opnd::IsRegOpnd(this_00);
  if ((!bVar2) || (bVar2 = IR::Opnd::IsSimd128(this_00), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x3dc,"(dst->IsRegOpnd() && dst->IsSimd128())",
                       "dst->IsRegOpnd() && dst->IsSimd128()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_01);
  if ((!bVar2) || (bVar2 = IR::Opnd::IsSimd128(this_01), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x3dd,"(src1->IsRegOpnd() && src1->IsSimd128())",
                       "src1->IsRegOpnd() && src1->IsSimd128()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_02);
  if ((!bVar2) || (bVar2 = IR::Opnd::IsSimd128(this_02), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x3de,"(src2->IsRegOpnd() && src2->IsSimd128())",
                       "src2->IsRegOpnd() && src2->IsSimd128()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IVar3 = IR::Opnd::GetType(this_01);
  dstOpnd = IR::RegOpnd::New(IVar3,this->m_func);
  IVar3 = IR::Opnd::GetType(this_01);
  dstOpnd_00 = IR::RegOpnd::New(IVar3,this->m_func);
  IVar3 = IR::Opnd::GetType(this_01);
  dstOpnd_01 = IR::RegOpnd::New(IVar3,this->m_func);
  pIVar5 = IR::Instr::New(PMULUDQ,&dstOpnd->super_Opnd,this_01,this_02,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar5);
  Legalize<false>(pIVar5,false);
  pIVar6 = IR::IntConstOpnd::New(4,TyInt8,this->m_func,true);
  pIVar5 = IR::Instr::New(PSRLDQ,&dstOpnd_00->super_Opnd,this_01,&pIVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar5);
  Legalize<false>(pIVar5,false);
  pIVar6 = IR::IntConstOpnd::New(4,TyInt8,this->m_func,true);
  pIVar5 = IR::Instr::New(PSRLDQ,&dstOpnd_01->super_Opnd,this_02,&pIVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar5);
  Legalize<false>(pIVar5,false);
  pIVar5 = IR::Instr::New(PMULUDQ,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,
                          &dstOpnd_01->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar5);
  Legalize<false>(pIVar5,false);
  pIVar6 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,true);
  pIVar5 = IR::Instr::New(PSHUFD,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&pIVar6->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(instr,pIVar5);
  pIVar6 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,true);
  pIVar5 = IR::Instr::New(PSHUFD,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,&pIVar6->super_Opnd
                          ,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar5);
  pIVar5 = IR::Instr::New(PUNPCKLDQ,this_00,&dstOpnd->super_Opnd,&dstOpnd_00->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(instr,pIVar5);
  Legalize<false>(pIVar5,false);
  pIVar5 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar5;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerMulI4(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::Simd128_Mul_I4 || instr->m_opcode == Js::OpCode::Simd128_Mul_U4);
    IR::Instr *pInstr;
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    IR::Opnd* temp1, *temp2, *temp3;
    Assert(dst->IsRegOpnd() && dst->IsSimd128());
    Assert(src1->IsRegOpnd() && src1->IsSimd128());
    Assert(src2->IsRegOpnd() && src2->IsSimd128());

    temp1 = IR::RegOpnd::New(src1->GetType(), m_func);
    temp2 = IR::RegOpnd::New(src1->GetType(), m_func);
    temp3 = IR::RegOpnd::New(src1->GetType(), m_func);

    // temp1 = PMULUDQ src1, src2
    pInstr = IR::Instr::New(Js::OpCode::PMULUDQ, temp1, src1, src2, m_func);
    instr->InsertBefore(pInstr);
    //MakeDstEquSrc1(pInstr);
    Legalize(pInstr);

    // temp2 = PSLRD src1, 0x4
    pInstr = IR::Instr::New(Js::OpCode::PSRLDQ, temp2, src1, IR::IntConstOpnd::New(TySize[TyInt32], TyInt8, m_func, true), m_func);
    instr->InsertBefore(pInstr);
    //MakeDstEquSrc1(pInstr);
    Legalize(pInstr);

    // temp3 = PSLRD src2, 0x4
    pInstr = IR::Instr::New(Js::OpCode::PSRLDQ, temp3, src2, IR::IntConstOpnd::New(TySize[TyInt32], TyInt8, m_func, true), m_func);
    instr->InsertBefore(pInstr);
    //MakeDstEquSrc1(pInstr);
    Legalize(pInstr);

    // temp2 = PMULUDQ temp2, temp3
    pInstr = IR::Instr::New(Js::OpCode::PMULUDQ, temp2, temp2, temp3, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    //PSHUFD temp1, temp1, 0x8
    instr->InsertBefore(IR::Instr::New(Js::OpCode::PSHUFD, temp1, temp1, IR::IntConstOpnd::New( 8 /*b00001000*/, TyInt8, m_func, true), m_func));

    //PSHUFD temp2, temp2, 0x8
    instr->InsertBefore(IR::Instr::New(Js::OpCode::PSHUFD, temp2, temp2, IR::IntConstOpnd::New(8 /*b00001000*/, TyInt8, m_func, true), m_func));

    // PUNPCKLDQ dst, temp1, temp2
    pInstr = IR::Instr::New(Js::OpCode::PUNPCKLDQ, dst, temp1, temp2, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    pInstr = instr->m_prev;
    instr->Remove();
    return pInstr;
}